

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O0

int ARKodeSetRelaxUpperBound(void *arkode_mem,sunrealtype upper)

{
  double in_XMM0_Qa;
  ARKodeRelaxMem relax_mem;
  ARKodeMem ark_mem;
  int retval;
  ARKodeMem *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  ARKodeMem in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = arkRelaxAccessMem(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                              in_stack_ffffffffffffffc8,(ARKodeRelaxMem *)0x18fa6a);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffd8->step_supports_relaxation == 0) {
      arkProcessError(in_stack_ffffffffffffffd8,-0x30,0x26f,"ARKodeSetRelaxUpperBound",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                      ,"time-stepping module does not support relaxation");
      local_4 = -0x30;
    }
    else {
      if (in_XMM0_Qa <= 1.0) {
        in_stack_ffffffffffffffd0[0x78] = '3';
        in_stack_ffffffffffffffd0[0x79] = '3';
        in_stack_ffffffffffffffd0[0x7a] = '3';
        in_stack_ffffffffffffffd0[0x7b] = '3';
        in_stack_ffffffffffffffd0[0x7c] = '3';
        in_stack_ffffffffffffffd0[0x7d] = '3';
        in_stack_ffffffffffffffd0[0x7e] = -0xd;
        in_stack_ffffffffffffffd0[0x7f] = '?';
      }
      else {
        *(double *)(in_stack_ffffffffffffffd0 + 0x78) = in_XMM0_Qa;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetRelaxUpperBound(void* arkode_mem, sunrealtype upper)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeRelaxMem relax_mem;

  retval = arkRelaxAccessMem(arkode_mem, __func__, &ark_mem, &relax_mem);
  if (retval) { return retval; }

  /* Guard against use for time steppers that do not allow relaxation */
  if (!ark_mem->step_supports_relaxation)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support relaxation");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  if (upper > ONE) { relax_mem->upper_bound = upper; }
  else { relax_mem->upper_bound = ARK_RELAX_DEFAULT_UPPER_BOUND; }

  return ARK_SUCCESS;
}